

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O3

int INT_CMcontact_self_check(CManager_conflict cm,attr_list attrs)

{
  transport_entry p_Var1;
  int iVar2;
  transport_entry_conflict *pp_Var3;
  
  if (cm->initialized == 0) {
    CMinitialize(cm);
  }
  pp_Var3 = cm->transports;
  while( true ) {
    if (pp_Var3 == (transport_entry_conflict *)0x0) {
      return 0;
    }
    p_Var1 = *pp_Var3;
    if (p_Var1 == (transport_entry)0x0) break;
    iVar2 = (*p_Var1->self_check)(cm,&CMstatic_trans_svcs,p_Var1,attrs);
    pp_Var3 = pp_Var3 + 1;
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  return 0;
}

Assistant:

int
 INT_CMcontact_self_check(CManager cm, attr_list attrs)
 {
     transport_entry *trans_list;
     if (!cm->initialized) CMinitialize(cm);
     trans_list = cm->transports;
     while ((trans_list != NULL) && (*trans_list != NULL)) {
	 int result = 0;
	 result = (*trans_list)->self_check(cm, &CMstatic_trans_svcs, 
					    *trans_list, attrs);
	 if (result) return result;
	 trans_list++;
     }
     return 0;
 }